

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_iterator.hpp
# Opt level: O2

bool __thiscall
boost::unit_test::utils::ut_detail::
delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>::operator()
          (delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_> *this
          ,char c)

{
  char cVar1;
  ti_delimeter_type tVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  
  tVar2 = this->m_type;
  if (tVar2 == dt_isspace) {
    iVar4 = isspace((int)c);
  }
  else {
    if (tVar2 != dt_ispunct) {
      if (tVar2 != dt_char) {
        return false;
      }
      pcVar5 = (this->m_delimeters).m_begin;
      do {
        bVar6 = pcVar5 == (this->m_delimeters).m_end;
        bVar3 = !bVar6;
        if (bVar6) {
          return bVar3;
        }
        cVar1 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar1 != c);
      return bVar3;
    }
    iVar4 = ispunct((int)c);
  }
  return iVar4 != 0;
}

Assistant:

bool        operator()( CharT c )
    {
        switch( m_type ) {
        case dt_char: {
            BOOST_TEST_FOREACH( CharT, delim, m_delimeters )
                if( CharCompare()( delim, c ) )
                    return true;

            return false;
        }
        case dt_ispunct:
            return (std::ispunct)( c ) != 0;
        case dt_isspace:
            return (std::isspace)( c ) != 0;
        case dt_none:
            return false;
        }

        return false;
    }